

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.hpp
# Opt level: O2

ostream * websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::
          timestamp(ostream *os)

{
  size_t sVar1;
  ostream *poVar2;
  char *pcVar3;
  time_t t;
  char buffer [20];
  tm lt;
  
  t = time((time_t *)0x0);
  localtime_r(&t,(tm *)&lt);
  sVar1 = strftime(buffer,0x14,"%Y-%m-%d %H:%M:%S",(tm *)&lt);
  pcVar3 = "Unknown";
  if (sVar1 != 0) {
    pcVar3 = buffer;
  }
  poVar2 = std::operator<<(os,pcVar3);
  return poVar2;
}

Assistant:

static std::ostream & timestamp(std::ostream & os) {
        std::time_t t = std::time(NULL);
        std::tm lt = lib::localtime(t);
        #ifdef _WEBSOCKETPP_PUTTIME_
            return os << std::put_time(&lt,"%Y-%m-%d %H:%M:%S");
        #else // Falls back to strftime, which requires a temporary copy of the string.
            char buffer[20];
            size_t result = std::strftime(buffer,sizeof(buffer),"%Y-%m-%d %H:%M:%S",&lt);
            return os << (result == 0 ? "Unknown" : buffer);
        #endif
    }